

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O2

void print_device_collection(cubeb_device_collection *collection,FILE *f)

{
  cubeb_device_type cVar1;
  cubeb_device_fmt cVar2;
  cubeb_device_info *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char local_78 [72];
  
  for (uVar7 = 0; uVar8 = (ulong)uVar7, uVar8 < collection->count; uVar7 = uVar7 + 1) {
    pcVar3 = collection->device;
    local_78[0x30] = '\0';
    local_78[0x31] = '\0';
    local_78[0x32] = '\0';
    local_78[0x33] = '\0';
    local_78[0x34] = '\0';
    local_78[0x35] = '\0';
    local_78[0x36] = '\0';
    local_78[0x37] = '\0';
    local_78[0x38] = '\0';
    local_78[0x39] = '\0';
    local_78[0x3a] = '\0';
    local_78[0x3b] = '\0';
    local_78[0x3c] = '\0';
    local_78[0x3d] = '\0';
    local_78[0x3e] = '\0';
    local_78[0x3f] = '\0';
    local_78[0x20] = '\0';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    local_78[0x28] = '\0';
    local_78[0x29] = '\0';
    local_78[0x2a] = '\0';
    local_78[0x2b] = '\0';
    local_78[0x2c] = '\0';
    local_78[0x2d] = '\0';
    local_78[0x2e] = '\0';
    local_78[0x2f] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    pcVar9 = "unknown?";
    if ((ulong)pcVar3[uVar8].state < 3) {
      pcVar9 = &DAT_00137544 + *(int *)(&DAT_00137544 + (ulong)pcVar3[uVar8].state * 4);
    }
    cVar1 = pcVar3[uVar8].type;
    cVar2 = pcVar3[uVar8].default_format;
    pcVar5 = "S16LE";
    if (cVar2 != CUBEB_DEVICE_FMT_S16LE) {
      if (cVar2 == CUBEB_DEVICE_FMT_F32BE) {
        pcVar5 = "F32BE";
      }
      else if (cVar2 == CUBEB_DEVICE_FMT_F32LE) {
        pcVar5 = "F32LE";
      }
      else if (cVar2 == CUBEB_DEVICE_FMT_S16BE) {
        pcVar5 = "S16BE";
      }
      else {
        pcVar5 = "unknown?";
      }
    }
    cVar2 = pcVar3[uVar8].format;
    if ((cVar2 & CUBEB_DEVICE_FMT_S16LE) != 0) {
      sVar4 = strlen(local_78);
      builtin_strncpy(local_78 + sVar4," S16LE",7);
    }
    if ((cVar2 & CUBEB_DEVICE_FMT_S16BE) != 0) {
      sVar4 = strlen(local_78);
      builtin_strncpy(local_78 + sVar4," S16BE",7);
    }
    if ((cVar2 >> 0xc & 1) != 0) {
      sVar4 = strlen(local_78);
      builtin_strncpy(local_78 + sVar4," F32LE",7);
    }
    if ((cVar2 >> 0xd & 1) != 0) {
      sVar4 = strlen(local_78);
      builtin_strncpy(local_78 + sVar4," F32BE",7);
    }
    pcVar10 = "unknown?";
    if (cVar1 == CUBEB_DEVICE_TYPE_OUTPUT) {
      pcVar10 = "output";
    }
    if (cVar1 == CUBEB_DEVICE_TYPE_INPUT) {
      pcVar10 = "input";
    }
    pcVar6 = " (PREFERRED)";
    if (pcVar3[uVar8].preferred == CUBEB_DEVICE_PREF_NONE) {
      pcVar6 = "";
    }
    fprintf((FILE *)f,
            "dev: \"%s\"%s\n\tName:    \"%s\"\n\tGroup:   \"%s\"\n\tVendor:  \"%s\"\n\tType:    %s\n\tState:   %s\n\tCh:      %u\n\tFormat:  %s (0x%x) (default: %s)\n\tRate:    %u - %u (default: %u)\n\tLatency: lo %u frames, hi %u frames\n"
            ,pcVar3[uVar8].device_id,pcVar6,pcVar3[uVar8].friendly_name,pcVar3[uVar8].group_id,
            pcVar3[uVar8].vendor_name,pcVar10,pcVar9,(ulong)pcVar3[uVar8].max_channels,
            local_78 + (local_78[0] != '\0'),(ulong)cVar2,pcVar5,(ulong)pcVar3[uVar8].min_rate,
            (ulong)pcVar3[uVar8].max_rate,(ulong)pcVar3[uVar8].default_rate,
            (ulong)pcVar3[uVar8].latency_lo,(ulong)pcVar3[uVar8].latency_hi);
  }
  return;
}

Assistant:

static void
print_device_collection(cubeb_device_collection * collection, FILE * f)
{
  uint32_t i;

  for (i = 0; i < collection->count; i++)
    print_device_info(&collection->device[i], f);
}